

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

void __thiscall luna::VM::ForInit(VM *this,Value *var,Value *limit,Value *step)

{
  RuntimeException *this_00;
  pair<const_char_*,_int> pVar1;
  
  if (var->type_ == ValueT_Number) {
    if (limit->type_ == ValueT_Number) {
      if (step->type_ == ValueT_Number) {
        return;
      }
      pVar1 = GetCurrentInstructionPos(this);
      this_00 = (RuntimeException *)__cxa_allocate_exception(0x20);
      RuntimeException::RuntimeException
                (this_00,pVar1.first,pVar1.second,step,"\'for\' step","number");
    }
    else {
      pVar1 = GetCurrentInstructionPos(this);
      this_00 = (RuntimeException *)__cxa_allocate_exception(0x20);
      RuntimeException::RuntimeException
                (this_00,pVar1.first,pVar1.second,limit,"\'for\' limit","number");
    }
  }
  else {
    pVar1 = GetCurrentInstructionPos(this);
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x20);
    RuntimeException::RuntimeException(this_00,pVar1.first,pVar1.second,var,"\'for\' init","number")
    ;
  }
  __cxa_throw(this_00,&RuntimeException::typeinfo,Exception::~Exception);
}

Assistant:

void VM::ForInit(Value *var, Value *limit, Value *step)
    {
        if (var->type_ != ValueT_Number)
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second,
                                   var, "'for' init", "number");
        }

        if (limit->type_ != ValueT_Number)
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second,
                                   limit, "'for' limit", "number");
        }

        if (step->type_ != ValueT_Number)
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second,
                                   step, "'for' step", "number");
        }
    }